

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::stack
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  stack<c4::yml::Parser::State,_16UL> *in_RSI;
  size_t in_RDI;
  stack<c4::yml::Parser::State,_16UL> *in_stack_000000b8;
  stack<c4::yml::Parser::State,_16UL> *in_stack_000000c0;
  
  stack(this,(Callbacks *)that);
  resize(in_RSI,in_RDI);
  _cp(in_stack_000000c0,in_stack_000000b8);
  return;
}

Assistant:

stack(stack const& that) noexcept : stack(that.m_callbacks)
    {
        resize(that.m_size);
        _cp(&that);
    }